

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

pair<unsigned_long,_llvm::dwarf::Tag> __thiscall
llvm::AppleAcceleratorTable::readAtoms(AppleAcceleratorTable *this,uint64_t *HashDataOffset)

{
  iterator ppVar1;
  unsigned_long *puVar2;
  undefined8 extraout_RDX;
  Optional<unsigned_long> OVar3;
  pair<unsigned_long,_llvm::dwarf::Tag> pVar4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_c0;
  undefined1 local_b8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_b0;
  undefined1 local_a8;
  FormParams local_9c;
  undefined1 local_98 [8];
  DWARFFormValue FormValue;
  pair<unsigned_short,_llvm::dwarf::Form> Atom;
  iterator __end1;
  iterator __begin1;
  ArrayRef<std::pair<unsigned_short,_llvm::dwarf::Form>_> *local_40;
  ArrayRef<std::pair<unsigned_short,_llvm::dwarf::Form>_> *__range1;
  FormParams FormParams;
  unsigned_long uStack_30;
  Tag DieTag;
  uint64_t DieOffset;
  uint64_t *HashDataOffset_local;
  AppleAcceleratorTable *this_local;
  Tag local_10;
  
  uStack_30 = 0xffffffff;
  __range1._6_2_ = 0;
  __range1._2_4_ = (FormParams)(uint)(this->Hdr).Version;
  ___begin1 = getAtomsDesc(this);
  local_40 = (ArrayRef<std::pair<unsigned_short,_llvm::dwarf::Form>_> *)&__begin1;
  __end1 = ArrayRef<std::pair<unsigned_short,_llvm::dwarf::Form>_>::begin(local_40);
  ppVar1 = ArrayRef<std::pair<unsigned_short,_llvm::dwarf::Form>_>::end(local_40);
  for (; __end1 != ppVar1; __end1 = __end1 + 1) {
    FormValue.C._4_4_ = *__end1;
    DWARFFormValue::DWARFFormValue((DWARFFormValue *)local_98,FormValue.C._6_2_);
    local_9c = __range1._2_4_;
    DWARFFormValue::extractValue
              ((DWARFFormValue *)local_98,&(this->super_DWARFAcceleratorTable).AccelSection,
               HashDataOffset,__range1._2_4_,(DWARFContext *)0x0,(DWARFUnit *)0x0);
    if (((uint)FormValue.C._4_4_ & 0xffff) == 1) {
      OVar3 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_98);
      local_b0 = OVar3.Storage.field_0;
      local_a8 = OVar3.Storage.hasVal;
      puVar2 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_b0);
      uStack_30 = *puVar2;
    }
    else if (((uint)FormValue.C._4_4_ & 0xffff) == 3) {
      OVar3 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_98);
      local_c0 = OVar3.Storage.field_0;
      local_b8 = OVar3.Storage.hasVal;
      puVar2 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_c0);
      __range1._6_2_ = (undefined2)*puVar2;
    }
  }
  std::pair<unsigned_long,_llvm::dwarf::Tag>::pair<unsigned_long_&,_llvm::dwarf::Tag_&,_true>
            ((pair<unsigned_long,_llvm::dwarf::Tag> *)&this_local,&stack0xffffffffffffffd0,
             (Tag *)((long)&__range1 + 6));
  pVar4._10_6_ = (undefined6)((ulong)extraout_RDX >> 0x10);
  pVar4.second = local_10;
  pVar4.first = (unsigned_long)this_local;
  return pVar4;
}

Assistant:

std::pair<uint64_t, dwarf::Tag>
AppleAcceleratorTable::readAtoms(uint64_t *HashDataOffset) {
  uint64_t DieOffset = dwarf::DW_INVALID_OFFSET;
  dwarf::Tag DieTag = dwarf::DW_TAG_null;
  dwarf::FormParams FormParams = {Hdr.Version, 0, dwarf::DwarfFormat::DWARF32};

  for (auto Atom : getAtomsDesc()) {
    DWARFFormValue FormValue(Atom.second);
    FormValue.extractValue(AccelSection, HashDataOffset, FormParams);
    switch (Atom.first) {
    case dwarf::DW_ATOM_die_offset:
      DieOffset = *FormValue.getAsUnsignedConstant();
      break;
    case dwarf::DW_ATOM_die_tag:
      DieTag = (dwarf::Tag)*FormValue.getAsUnsignedConstant();
      break;
    default:
      break;
    }
  }
  return {DieOffset, DieTag};
}